

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

void mod2sparse_copycols(mod2sparse *m,mod2sparse *r,int *cols)

{
  int iVar1;
  uint uVar2;
  mod2sparse *pmVar3;
  FILE *__stream;
  long lVar4;
  ulong uVar5;
  mod2entry *pmVar6;
  ulong uStack_60;
  
  pmVar3 = r;
  __stream = (FILE *)m;
  if (r->n_rows < m->n_rows) {
LAB_00121c7d:
    mod2sparse_copycols_cold_2();
    iVar1 = pmVar3->n_rows;
    uVar2 = 1;
    uStack_60 = 0x100000000;
    if ((((10 < iVar1) && (uStack_60 = 0x200000000, 100 < iVar1)) &&
        (uStack_60 = 0x300000000, 1000 < iVar1)) && (uStack_60 = 0x400000000, 10000 < iVar1)) {
      uStack_60 = (ulong)((100000 < iVar1) + 5) << 0x20;
    }
    iVar1 = pmVar3->n_cols;
    if (((10 < iVar1) && (uVar2 = 2, 100 < iVar1)) &&
       ((uVar2 = 3, 1000 < iVar1 && (uVar2 = 4, 10000 < iVar1)))) {
      uVar2 = (100000 < iVar1) + 5;
    }
    if (0 < pmVar3->n_rows) {
      uVar5 = 0;
      do {
        fprintf(__stream,"%*d:",uStack_60 >> 0x20,uVar5 & 0xffffffff);
        for (pmVar6 = pmVar3->rows[uVar5].right; -1 < pmVar6->row; pmVar6 = pmVar6->right) {
          fprintf(__stream," %*d",(ulong)uVar2,(ulong)(uint)pmVar6->col);
        }
        fputc(10,__stream);
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)pmVar3->n_rows);
    }
    return;
  }
  __stream = (FILE *)r;
  mod2sparse_clear(r);
  if (0 < r->n_cols) {
    lVar4 = 0;
    do {
      iVar1 = cols[lVar4];
      if (((long)iVar1 < 0) || (m->n_cols <= iVar1)) {
        mod2sparse_copycols_cold_1();
        goto LAB_00121c7d;
      }
      pmVar6 = m->cols[iVar1].down;
      while( true ) {
        uVar2 = pmVar6->row;
        pmVar3 = (mod2sparse *)(ulong)uVar2;
        if ((int)uVar2 < 0) break;
        __stream = (FILE *)r;
        mod2sparse_insert(r,uVar2,(int)lVar4);
        pmVar6 = pmVar6->down;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < r->n_cols);
  }
  return;
}

Assistant:

void mod2sparse_copycols
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *cols		/* Indexes of columns to copy, from 0 */
)
{ 
  mod2entry *e;
  int j;

  if (mod2sparse_rows(m)>mod2sparse_rows(r))
  { fprintf(stderr,
      "mod2sparse_copycols: Destination matrix has fewer rows than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (j = 0; j<mod2sparse_cols(r); j++)
  { if (cols[j]<0 || cols[j]>=mod2sparse_cols(m))
    { fprintf(stderr,"mod2sparse_copycols: Column index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_col(m,cols[j]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,e->row,j);
      e = mod2sparse_next_in_col(e);
    }
  }
}